

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  uint uVar5;
  ImGuiContext *pIVar6;
  int char_count;
  bool is_last_line;
  bool is_first_line;
  char *line_end;
  char *line_start;
  ImGuiContext *pIStack_40;
  int tree_depth;
  char *text_remaining;
  bool log_new_line;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *text_end_local;
  char *text_local;
  ImVec2 *ref_pos_local;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  g = (ImGuiContext *)text_end;
  if (text_end == (char *)0x0) {
    g = (ImGuiContext *)FindRenderedTextEnd(text,(char *)0x0);
  }
  bVar2 = false;
  if (ref_pos != (ImVec2 *)0x0) {
    bVar2 = pIVar3->LogLinePosY + 1.0 < ref_pos->y;
    pIVar3->LogLinePosY = ref_pos->y;
  }
  if (bVar2) {
    pIVar3->LogLineFirstItem = true;
  }
  if ((pIVar1->DC).TreeDepth < pIVar3->LogDepthRef) {
    pIVar3->LogDepthRef = (pIVar1->DC).TreeDepth;
  }
  iVar4 = (pIVar1->DC).TreeDepth - pIVar3->LogDepthRef;
  pIStack_40 = (ImGuiContext *)text;
  while( true ) {
    pIVar6 = (ImGuiContext *)ImStreolRange(&pIStack_40->Initialized,&g->Initialized);
    if ((pIVar6 == g) && (pIStack_40 == pIVar6)) {
      if (bVar2) {
        LogText("\n");
        return;
      }
    }
    else {
      uVar5 = (int)pIVar6 - (int)pIStack_40;
      if ((bVar2) || (pIStack_40 != (ImGuiContext *)text)) {
        LogText("\n%*s%.*s",(ulong)(uint)(iVar4 * 4),"",(ulong)uVar5,pIStack_40);
      }
      else if ((pIVar3->LogLineFirstItem & 1U) == 0) {
        LogText(" %.*s",(ulong)uVar5,pIStack_40);
      }
      else {
        LogText("%*s%.*s",(ulong)(uint)(iVar4 * 4),"",(ulong)uVar5,pIStack_40);
      }
      pIVar3->LogLineFirstItem = false;
    }
    if (pIVar6 == g) break;
    pIStack_40 = (ImGuiContext *)&pIVar6->FontAtlasOwnedByContext;
  }
  return;
}

Assistant:

void ImGui::LogRenderedText(const ImVec2* ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!text_end)
        text_end = FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos && (ref_pos->y > g.LogLinePosY + 1);
    if (ref_pos)
        g.LogLinePosY = ref_pos->y;
    if (log_new_line)
        g.LogLineFirstItem = true;

    const char* text_remaining = text;
    if (g.LogDepthRef > window->DC.TreeDepth)  // Re-adjust padding if we have popped out of our starting depth
        g.LogDepthRef = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogDepthRef);
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by spacing corresponding to the current depth of our log entry.
        // We don't add a trailing \n to allow a subsequent item on the same line to be captured.
        const char* line_start = text_remaining;
        const char* line_end = ImStreolRange(line_start, text_end);
        const bool is_first_line = (line_start == text);
        const bool is_last_line = (line_end == text_end);
        if (!is_last_line || (line_start != line_end))
        {
            const int char_count = (int)(line_end - line_start);
            if (log_new_line || !is_first_line)
                LogText(IM_NEWLINE "%*s%.*s", tree_depth * 4, "", char_count, line_start);
            else if (g.LogLineFirstItem)
                LogText("%*s%.*s", tree_depth * 4, "", char_count, line_start);
            else
                LogText(" %.*s", char_count, line_start);
            g.LogLineFirstItem = false;
        }
        else if (log_new_line)
        {
            // An empty "" string at a different Y position should output a carriage return.
            LogText(IM_NEWLINE);
            break;
        }

        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }
}